

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

ArgInfo * __thiscall SoapySDR::Device::getSettingInfo(Device *this,string *key)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator cVar2;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  this_01;
  ArgInfo *in_RDX;
  long *in_RSI;
  ArgInfo *in_RDI;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  argInfoIter;
  ArgInfoList allArgInfos;
  ArgInfo *__lhs;
  anon_class_8_1_ba1d59bf_for__M_pred in_stack_ffffffffffffff98;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  local_38 [4];
  ArgInfo *local_18;
  
  __lhs = in_RDI;
  local_18 = in_RDX;
  (**(code **)(*in_RSI + 800))();
  this_00 = std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::begin(in_RDI);
  cVar2 = std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::end(in_RDI);
  this_01 = std::
            find_if<__gnu_cxx::__normal_iterator<SoapySDR::ArgInfo_const*,std::vector<SoapySDR::ArgInfo,std::allocator<SoapySDR::ArgInfo>>>,SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
                      );
  local_38[0] = this_01;
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::end
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)in_RDI);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
                      *)__lhs,(__normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
                               *)in_RDI);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
    ::operator*(local_38);
    ArgInfo::ArgInfo(this_00._M_current,cVar2._M_current);
  }
  else {
    ArgInfo::ArgInfo(local_18);
  }
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)this_01._M_current);
  return __lhs;
}

Assistant:

SoapySDR::ArgInfo SoapySDR::Device::getSettingInfo(const std::string &key) const
{
    const auto allArgInfos = this->getSettingInfo();
    auto argInfoIter = std::find_if(
        allArgInfos.begin(),
        allArgInfos.end(),
        [&key](const SoapySDR::ArgInfo &argInfo)
        {
            return (argInfo.key == key);
        });

    return (argInfoIter != allArgInfos.end()) ? (*argInfoIter) : SoapySDR::ArgInfo();
}